

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O3

deMemPool * deMemPool_create(deMemPool *parent)

{
  deMemPool *pdVar1;
  undefined8 *puVar2;
  deMemPool *pdVar3;
  deMemPoolUtil *pdVar4;
  
  puVar2 = (undefined8 *)deMalloc(0x90);
  if (puVar2 != (undefined8 *)0x0) {
    pdVar4 = (deMemPoolUtil *)0x0;
    puVar2[1] = 0;
    *puVar2 = 0x4000000080;
    pdVar3 = (deMemPool *)(puVar2 + 2);
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar2[9] = puVar2;
    puVar2[3] = parent;
    if (parent != (deMemPool *)0x0) {
      parent->numChildren = parent->numChildren + 1;
      pdVar1 = parent->firstChild;
      if (pdVar1 != (deMemPool *)0x0) {
        pdVar1->prevPool = pdVar3;
      }
      puVar2[8] = pdVar1;
      parent->firstChild = pdVar3;
      pdVar4 = parent->util;
    }
    puVar2[4] = pdVar4;
    if (pdVar3 != (deMemPool *)0x0) {
      return pdVar3;
    }
  }
  pdVar4 = parent->util;
  if (pdVar4 != (deMemPoolUtil *)0x0) {
    (*pdVar4->allocFailCallback)(pdVar4->userPointer);
  }
  return (deMemPool *)0x0;
}

Assistant:

deMemPool* deMemPool_create (deMemPool* parent)
{
	deMemPool* pool;
	DE_ASSERT(parent);
	pool = createPoolInternal(parent);
	if (!pool && parent->util)
		parent->util->allocFailCallback(parent->util->userPointer);
	return pool;
}